

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gram.c
# Opt level: O2

Elem * new_utf8_char(Grammar *g,char *s,char *e,Rule *r)

{
  byte bVar1;
  ulong in_RAX;
  Elem *pEVar2;
  char *e_00;
  undefined1 uVar3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  undefined8 uStack_18;
  
  e_00 = (char *)((long)&uStack_18 + 7);
  lVar5 = 1;
  uVar4 = 0;
  do {
    if (e < s + 3) {
      uVar3 = (undefined1)uVar4;
      uStack_18._0_4_ = (undefined4)in_RAX;
      uStack_18._5_3_ = (undefined3)(in_RAX >> 0x28);
      if (uVar4 < 0x80) {
        uStack_18._0_5_ = CONCAT14(uVar3,(undefined4)uStack_18);
        e_00 = (char *)((long)&uStack_18 + 5);
      }
      else {
        uStack_18._6_2_ = (undefined2)(in_RAX >> 0x30);
        if (uVar4 < 0x800) {
          e_00 = (char *)((long)&uStack_18 + 6);
          uStack_18 = CONCAT26(uStack_18._6_2_,
                               CONCAT15(uVar3,CONCAT14((char)(uVar4 >> 6),(undefined4)uStack_18))) &
                      0xffff3fffffffffff | 0x80c000000000;
        }
        else if (uVar4 < 0x10000) {
          uVar4 = CONCAT26(uStack_18._6_2_,
                           CONCAT15((char)(uVar4 >> 6),
                                    CONCAT14((char)(uVar4 >> 0xc),(undefined4)uStack_18))) &
                  0xffff3fffffffffff;
          uStack_18._7_1_ = (undefined1)(uVar4 >> 0x38);
          uStack_18 = CONCAT17(uStack_18._7_1_,CONCAT16(uVar3,(int6)uVar4)) & 0xff3fffffffffffff |
                      0x8080e000000000;
        }
        else if (uVar4 < 0x2000000) {
          e_00 = &stack0xfffffffffffffff0;
          uStack_18 = CONCAT44(((uint)uVar4 << 0x18 |
                               ((uint)uVar4 & 0x3fc0) << 10 |
                               (uint)(uVar4 >> 0x12) & 0xff | (uint)(uVar4 >> 4) & 0xff00) &
                               (uint)DAT_0014a430 | (uint)DAT_0014a440,(undefined4)uStack_18);
        }
        else {
          uStack_18 = in_RAX;
          d_fail(
                "UTF32 Unicode value U+%8X too large for valid UTF-8 encoding (cf. Unicode Spec 4.0, section 3.9)"
                );
          e_00 = (char *)((long)&uStack_18 + 4);
        }
      }
      pEVar2 = new_term_string(g,(char *)((long)&uStack_18 + 4),e_00,r);
      ((pEVar2->e).term)->kind = TERM_STRING;
      return pEVar2;
    }
    bVar1 = e[-1];
    if ((byte)(bVar1 - 0x30) < 10) {
      uVar6 = (uint)(byte)(bVar1 - 0x30);
LAB_00139e7c:
      uVar4 = uVar4 + (ulong)uVar6 * lVar5;
    }
    else if (((byte)(bVar1 + 0x9f) < 6) || ((byte)(bVar1 + 0xbf) < 6)) {
      uVar6 = bVar1 + 9 & 0x1f;
      goto LAB_00139e7c;
    }
    e = e + -1;
    lVar5 = lVar5 << 4;
  } while( true );
}

Assistant:

Elem *new_utf8_char(Grammar *g, char *s, char *e, Rule *r) {
  char utf8_code[4];
  unsigned long utf32_code, base, len = 0;
  Elem *x;
  for (utf32_code = 0, base = 1; e >= s + 3; base *= 16) {
    e--;
    if (*e >= '0' && *e <= '9')
      utf32_code += base * (*e - '0');
    else if (*e >= 'a' && *e <= 'f')
      utf32_code += base * (*e - 'a' + 10);
    else if (*e >= 'A' && *e <= 'F')
      utf32_code += base * (*e - 'A' + 10);
  }
  if (utf32_code < 0x80) {
    utf8_code[0] = utf32_code;
    len = 1;
  } else if (utf32_code < 0x800) {
    utf8_code[0] = 0xc0 | ((utf32_code >> 6) & 0x1f);
    utf8_code[1] = 0x80 | (utf32_code & 0x3f);
    len = 2;
  } else if (utf32_code < 0x10000) {
    utf8_code[0] = 0xe0 | ((utf32_code >> 12) & 0x0f);
    utf8_code[1] = 0x80 | ((utf32_code >> 6) & 0x3f);
    utf8_code[2] = 0x80 | (utf32_code & 0x3f);
    len = 3;
  } else if (utf32_code < 0x02000000) {
    utf8_code[0] = 0xf0 | ((utf32_code >> 18) & 0x07);
    utf8_code[1] = 0x80 | ((utf32_code >> 12) & 0x3f);
    utf8_code[2] = 0x80 | ((utf32_code >> 6) & 0x3f);
    utf8_code[3] = 0x80 | (utf32_code & 0x3f);
    len = 4;
  } else {
    d_fail("UTF32 Unicode value U+%8X too large for valid UTF-8 encoding (cf. Unicode Spec 4.0, section 3.9)",
           utf32_code);
  }
  x = new_term_string(g, utf8_code, utf8_code + len, r);
  x->e.term->kind = TERM_STRING;
  return x;
}